

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapOneofField<false>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  int key;
  int iVar1;
  LogMessage *pLVar2;
  FieldDescriptor *field;
  double *pdVar3;
  uint *puVar4;
  float *pfVar5;
  bool *pbVar6;
  FieldDescriptor *field_00;
  Message *sub_message;
  int *piVar7;
  ulong uVar8;
  LocalVarWrapper temp;
  Reflection *local_e0;
  Message *local_d8;
  FieldDescriptor *local_d0;
  FieldDescriptor *local_c8;
  undefined1 local_c0 [56];
  Message *local_88;
  string local_80;
  int local_5c;
  FieldDescriptor *local_58;
  Reflection *local_50;
  Message *local_48;
  FieldDescriptor *local_40;
  LogMessage *local_38;
  
  iVar1 = *(int *)(oneof_descriptor + 4);
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_c0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
    iVar1 = *(int *)(oneof_descriptor + 4);
  }
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_c0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
    iVar1 = *(int *)(oneof_descriptor + 4);
  }
  uVar8 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) *
                        0x33333334 + (this->schema_).oneof_case_offset_);
  key = *(int *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar8);
  if ((iVar1 == 1) && ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)local_c0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
    uVar8 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                       *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 3) *
                          0x33333334 + (this->schema_).oneof_case_offset_);
  }
  iVar1 = *(int *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar8);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_5c = key;
  if (key == 0) {
    field = (FieldDescriptor *)0x0;
    goto LAB_0039ddb9;
  }
  field = Descriptor::FindFieldByNumber(this->descriptor_,key);
  local_e0 = this;
  local_d8 = lhs;
  local_d0 = field;
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_c8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_c0,&local_c8);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
    puVar4 = (uint *)GetRaw<int>(local_e0,local_d8,local_d0);
    goto LAB_0039dc81;
  case 2:
    pdVar3 = (double *)GetRaw<long>(local_e0,local_d8,local_d0);
    goto LAB_0039dca0;
  case 3:
    puVar4 = GetRaw<unsigned_int>(local_e0,local_d8,local_d0);
    goto LAB_0039dc81;
  case 4:
    pdVar3 = (double *)GetRaw<unsigned_long>(local_e0,local_d8,local_d0);
LAB_0039dca0:
    local_88 = (Message *)*pdVar3;
    break;
  case 5:
    pdVar3 = GetRaw<double>(local_e0,local_d8,local_d0);
    local_88 = (Message *)*pdVar3;
    break;
  case 6:
    pfVar5 = GetRaw<float>(local_e0,local_d8,local_d0);
    local_88 = (Message *)CONCAT44(local_88._4_4_,*pfVar5);
    break;
  case 7:
    pbVar6 = GetRaw<bool>(local_e0,local_d8,local_d0);
    local_88 = (Message *)CONCAT71(local_88._1_7_,*pbVar6);
    break;
  case 8:
    puVar4 = (uint *)GetRaw<int>(local_e0,local_d8,local_d0);
LAB_0039dc81:
    local_88 = (Message *)CONCAT44(local_88._4_4_,*puVar4);
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_c0,local_e0,local_d8,local_d0);
    std::__cxx11::string::_M_assign((string *)&local_80);
    if ((Message *)local_c0._0_8_ != (Message *)(local_c0 + 0x10)) {
      operator_delete((void *)local_c0._0_8_);
    }
    break;
  case 10:
    local_88 = ReleaseMessage(local_e0,local_d8,local_d0,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_c0,"unimplemented type: ");
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_c8 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_58 = field;
      local_38 = pLVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c8,
                 &local_58);
      pLVar2 = local_38;
    }
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                       (ulong)(byte)field[2] * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_c0);
  }
LAB_0039ddb9:
  if (iVar1 == 0) {
    ClearOneof(this,lhs,oneof_descriptor);
  }
  else {
    field_00 = Descriptor::FindFieldByNumber(this->descriptor_,iVar1);
    local_e0 = this;
    local_d8 = lhs;
    local_d0 = field_00;
    local_50 = this;
    local_48 = rhs;
    local_40 = field_00;
    if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
      local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_c8 = field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)local_c0,
                 &local_c8);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field_00[2] * 4)) {
    case 1:
      piVar7 = GetRaw<int>(this,rhs,field_00);
      local_c0._0_4_ = *piVar7;
      SetField<int>(local_e0,local_d8,local_d0,(int *)local_c0);
      break;
    case 2:
      pdVar3 = (double *)GetRaw<long>(this,rhs,field_00);
      local_c0._0_8_ = *pdVar3;
      SetField<long>(local_e0,local_d8,local_d0,(long *)local_c0);
      break;
    case 3:
      puVar4 = GetRaw<unsigned_int>(this,rhs,field_00);
      local_c0._0_4_ = *puVar4;
      SetField<unsigned_int>(local_e0,local_d8,local_d0,(uint *)local_c0);
      break;
    case 4:
      pdVar3 = (double *)GetRaw<unsigned_long>(this,rhs,field_00);
      local_c0._0_8_ = *pdVar3;
      SetField<unsigned_long>(local_e0,local_d8,local_d0,(unsigned_long *)local_c0);
      break;
    case 5:
      pdVar3 = GetRaw<double>(this,rhs,field_00);
      local_c0._0_8_ = *pdVar3;
      SetField<double>(local_e0,local_d8,local_d0,(double *)local_c0);
      break;
    case 6:
      pfVar5 = GetRaw<float>(this,rhs,field_00);
      local_c0._0_4_ = *pfVar5;
      SetField<float>(local_e0,local_d8,local_d0,(float *)local_c0);
      break;
    case 7:
      pbVar6 = GetRaw<bool>(this,rhs,field_00);
      local_c0[0] = *pbVar6;
      SetField<bool>(local_e0,local_d8,local_d0,(bool *)local_c0);
      break;
    case 8:
      piVar7 = GetRaw<int>(this,rhs,field_00);
      local_c0._0_4_ = *piVar7;
      SetField<int>(local_e0,local_d8,local_d0,(int *)local_c0);
      break;
    case 9:
      GetString_abi_cxx11_((string *)local_c0,this,rhs,field_00);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_e0,(string *)local_c0);
      if ((Message *)local_c0._0_8_ != (Message *)(local_c0 + 0x10)) {
        operator_delete((void *)local_c0._0_8_);
      }
      break;
    case 10:
      sub_message = ReleaseMessage(this,rhs,field_00,(MessageFactory *)0x0);
      SetAllocatedMessage(local_e0,local_d8,sub_message,local_d0);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_c0,"unimplemented type: ");
      if (*(once_flag **)(field_00 + 0x18) != (once_flag *)0x0) {
        local_c8 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_58 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c8,
                   &local_58);
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)field_00[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_c0);
    }
  }
  if (local_5c == 0) {
    ClearOneof(this,rhs,oneof_descriptor);
  }
  else {
    local_50 = this;
    local_48 = rhs;
    local_40 = field;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_c8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_c0,&local_c8
                );
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
    case 1:
      local_c0._0_4_ = local_88._0_4_;
      SetField<int>(this,rhs,field,(int *)local_c0);
      break;
    case 2:
      local_c0._0_8_ = local_88;
      SetField<long>(this,rhs,field,(long *)local_c0);
      break;
    case 3:
      local_c0._0_4_ = local_88._0_4_;
      SetField<unsigned_int>(this,rhs,field,(uint *)local_c0);
      break;
    case 4:
      local_c0._0_8_ = local_88;
      SetField<unsigned_long>(this,rhs,field,(unsigned_long *)local_c0);
      break;
    case 5:
      local_c0._0_8_ = local_88;
      SetField<double>(this,rhs,field,(double *)local_c0);
      break;
    case 6:
      local_c0._0_4_ = local_88._0_4_;
      SetField<float>(this,rhs,field,(float *)local_c0);
      break;
    case 7:
      local_c0[0] = local_88._0_1_;
      SetField<bool>(this,rhs,field,(bool *)local_c0);
      break;
    case 8:
      local_c0._0_4_ = local_88._0_4_;
      SetField<int>(this,rhs,field,(int *)local_c0);
      break;
    case 9:
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_50,&local_80);
      break;
    case 10:
      SetAllocatedMessage(this,rhs,local_88,field);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_c0,"unimplemented type: ");
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_c8 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_58 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c8,
                   &local_58);
      }
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)field[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar2);
      internal::LogMessage::~LogMessage((LogMessage *)local_c0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}